

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::D3MF::XmlSerializer::parseColor(XmlSerializer *this,char *color,aiColor4D *diffuse)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  char comp [3];
  char local_2b;
  char local_2a;
  undefined1 local_29;
  
  if (color != (char *)0x0) {
    sVar2 = strlen(color);
    if (((sVar2 == 9) || (sVar2 == 7)) && (*color == '#')) {
      local_29 = 0;
      local_2b = color[1];
      local_2a = color[2];
      lVar3 = strtol(&local_2b,(char **)0x0,0x10);
      diffuse->r = (float)lVar3 / 255.0;
      local_2b = color[3];
      local_2a = color[4];
      lVar3 = strtol(&local_2b,(char **)0x0,0x10);
      diffuse->g = (float)lVar3 / 255.0;
      local_2b = color[5];
      local_2a = color[6];
      lVar3 = strtol(&local_2b,(char **)0x0,0x10);
      diffuse->b = (float)lVar3 / 255.0;
      if (sVar2 != 7) {
        local_2b = color[7];
        local_2a = color[8];
        lVar3 = strtol(&local_2b,(char **)0x0,0x10);
        diffuse->a = (float)lVar3 / 255.0;
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool parseColor( const char *color, aiColor4D &diffuse ) {
        if ( nullptr == color ) {
            return false;
        }

        //format of the color string: #RRGGBBAA or #RRGGBB (3MF Core chapter 5.1.1)
        const size_t len( strlen( color ) );
        if ( 9 != len && 7 != len) {
            return false;
        }

        const char *buf( color );
        if ( '#' != *buf ) {
            return false;
        }
        ++buf;
        char comp[ 3 ] = { 0,0,'\0' };

        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.r = static_cast<ai_real>( strtol( comp, NULL, 16 ) ) / ai_real(255.0);


        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.g = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.b = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        if(7 == len)
            return true;
        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.a = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        return true;
    }